

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int res;
  mcu8str cmdname;
  nccfgstate state;
  mcu8str *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  nccfgstate *in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  iVar1 = mcplcfg_boolopt_expects_shlibdir_override();
  if (iVar1 != 0) {
    if (((in_EDI < 3) || (**(char **)(in_RSI + (long)(in_EDI + -2) * 8) != '+')) ||
       (*(char *)(*(long *)(in_RSI + (long)(in_EDI + -2) * 8) + 1) != '\0')) {
      mcplcfg_thiscmdname(in_stack_ffffffffffffffa0);
      fprintf(_stderr,"%s: installation error (shlibdir override absent).\n",
              in_stack_ffffffffffffff80);
      mcu8str_dealloc(in_stack_ffffffffffffff80);
      return 1;
    }
    mcu8str_create_from_cstr(in_stack_ffffffffffffff90);
  }
  iVar1 = mainprog((nccfgstate *)CONCAT44(uVar3,uVar2));
  mcu8str_dealloc(in_stack_ffffffffffffff80);
  mcu8str_dealloc(in_stack_ffffffffffffff80);
  return iVar1;
}

Assistant:

int main ( int argc, char** argv )
{
  nccfgstate state;
  state.argc = argc;
  state.argv = argv;
  state.bindir.c_str = NULL;
  state.bindir.size = 0;
  state.bindir.buflen = 0;
  state.bindir.owns_memory = 0;
  state.shlibdir_override.c_str = NULL;
  state.shlibdir_override.size = 0;
  state.shlibdir_override.buflen = 0;
  state.shlibdir_override.owns_memory = 0;

  if ( mcplcfg_boolopt_expects_shlibdir_override() ) {
    //Expects hidden trailing arguments '+' 'shlibdir' (to support having
    //MCPL.dll in %PATH% on windows)
    if ( argc >= 3 && argv[argc-2][0] == '+' && argv[argc-2][1] == '\0'  ) {
      state.shlibdir_override = mcu8str_create_from_cstr( argv[argc-1] );
      state.argc -= 2;
    } else {
      mcu8str cmdname = mcplcfg_thiscmdname(&state);
      fprintf(stderr,"%s: installation error (shlibdir override absent).\n",
              cmdname.c_str);
      mcu8str_dealloc(&cmdname);
      return 1;
    }
  }

  int res = mainprog( &state );
  mcu8str_dealloc(&state.bindir);
  mcu8str_dealloc(&state.shlibdir_override);
  return res;
}